

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.h
# Opt level: O1

int LZ4_compress_fast_continue
              (LZ4_stream_t *LZ4_stream,char *source,char *dest,int inputSize,int maxOutputSize,
              int acceleration)

{
  uint8_t *puVar1;
  long lVar2;
  char cVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint32_t uVar7;
  BYTE *s;
  uint8_t *puVar8;
  long *plVar9;
  uint uVar10;
  long *plVar11;
  long lVar12;
  ulong uVar13;
  int *piVar14;
  long *plVar15;
  char *pcVar16;
  int *piVar17;
  BYTE *d_2;
  ulong uVar18;
  long *plVar19;
  uint8_t *puVar20;
  int *piVar21;
  BYTE *pBVar22;
  char *pcVar23;
  ulong uVar24;
  uint uVar25;
  int iVar26;
  long *plVar27;
  char *pcVar28;
  long *plVar29;
  char cVar30;
  char *in_R10;
  long lVar31;
  int iVar32;
  BYTE *e;
  uint8_t *puVar33;
  int iVar34;
  BYTE *pBVar35;
  ulong uVar36;
  BYTE *d;
  U32 *hashTable;
  long *local_c8;
  long *local_c0;
  long *local_b0;
  long *local_90;
  char *local_78;
  char *local_40;
  
  if ((LZ4_stream->internal_donotuse).initCheck != 0) {
    return 0;
  }
  piVar14 = (int *)(ulong)(uint)inputSize;
  pBVar35 = (LZ4_stream->internal_donotuse).dictionary + (LZ4_stream->internal_donotuse).dictSize;
  pBVar22 = (BYTE *)source;
  if (pBVar35 < source) {
    pBVar22 = pBVar35;
  }
  if ((LZ4_stream->internal_donotuse).dictSize == 0) {
    pBVar22 = (BYTE *)source;
  }
  LZ4_renormDictT(&LZ4_stream->internal_donotuse,pBVar22);
  iVar4 = 1;
  if (1 < acceleration) {
    iVar4 = acceleration;
  }
  pBVar22 = (BYTE *)(source + inputSize);
  if (pBVar22 < pBVar35 && (BYTE *)LZ4_stream->table[0x801] < pBVar22) {
    uVar5 = (int)pBVar35 - (int)pBVar22;
    uVar10 = 0x10000;
    if (uVar5 < 0x10000) {
      uVar10 = uVar5;
    }
    uVar18 = 0;
    if (3 < uVar5) {
      uVar18 = (ulong)uVar10;
    }
    (LZ4_stream->internal_donotuse).dictSize = (uint32_t)uVar18;
    (LZ4_stream->internal_donotuse).dictionary = pBVar35 + -uVar18;
  }
  uVar10 = (LZ4_stream->internal_donotuse).dictSize;
  uVar18 = (ulong)uVar10;
  iVar32 = (int)dest;
  if (pBVar35 == (BYTE *)source) {
    local_c0 = (long *)source;
    if (uVar10 < 0x10000) {
      uVar5 = (LZ4_stream->internal_donotuse).currentOffset;
      if (uVar5 <= uVar10) goto LAB_0010902d;
      iVar34 = 0;
      if (0x7e000000 < (uint)inputSize) goto LAB_00109b18;
      plVar29 = (long *)dest;
      if (0xc < inputSize) {
        piVar17 = (int *)(source + -uVar18);
        pcVar23 = dest + maxOutputSize;
        lVar12 = (long)source - (ulong)uVar5;
        *(uint *)((long)LZ4_stream + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4) =
             uVar5;
        plVar19 = (long *)(source + 1);
        uVar18 = (ulong)(*(long *)(source + 1) * -0x30e4432345000000) >> 0x34;
        plVar11 = (long *)dest;
        do {
          uVar24 = 1;
          uVar36 = uVar18;
          uVar10 = iVar4 << 6;
          while( true ) {
            plVar29 = (long *)(uVar24 + (long)plVar19);
            iVar34 = (int)plVar19;
            iVar6 = (int)lVar12;
            if (pBVar22 + -0xc < plVar29) break;
            piVar14 = (int *)((ulong)*(uint *)((long)LZ4_stream + uVar36 * 4) + lVar12);
            uVar18 = (ulong)(*plVar29 * -0x30e4432345000000) >> 0x34;
            *(int *)((long)LZ4_stream + uVar36 * 4) = iVar34 - iVar6;
            if (((piVar17 <= piVar14) && (plVar19 <= (long *)((long)piVar14 + 0xffffU))) &&
               (*piVar14 == (int)*plVar19)) {
              iVar26 = 0;
              goto LAB_001096b5;
            }
            uVar24 = (ulong)(uVar10 >> 6);
            uVar10 = uVar10 + 1;
            plVar19 = plVar29;
            uVar36 = uVar18;
          }
          iVar26 = 3;
          uVar18 = uVar36;
LAB_001096b5:
          plVar29 = plVar11;
          if (iVar26 == 0) {
            uVar5 = iVar34 - (int)local_c0;
            lVar2 = 0;
            uVar10 = uVar5 - 0xf;
            cVar3 = (char)plVar19 * '\x10' + (char)local_c0 * -0x10;
            do {
              cVar30 = cVar3;
              uVar25 = uVar10;
              lVar31 = lVar2;
              piVar21 = (int *)((long)piVar14 + lVar31);
              plVar15 = (long *)((long)plVar19 + lVar31);
              if ((piVar21 <= piVar17) || (plVar15 <= local_c0)) break;
              lVar2 = lVar31 + -1;
              uVar10 = uVar25 - 1;
              cVar3 = cVar30 + -0x10;
            } while (*(char *)((long)plVar19 + lVar31 + -1) ==
                     *(char *)((long)piVar14 + lVar31 + -1));
            iVar26 = (int)lVar31;
            uVar36 = (ulong)(uint)(iVar26 + (iVar34 - (int)local_c0));
            plVar29 = (long *)((long)plVar11 + 1);
            pcVar16 = (char *)((long)plVar11 +
                              ((ulong)uVar5 + lVar31 & 0xffffffff) / 0xff + uVar36 + 9);
            if (pcVar16 <= pcVar23) {
              if ((uint)((ulong)uVar5 + lVar31) < 0xf) {
                *(char *)plVar11 = cVar30;
                plVar19 = plVar29;
              }
              else {
                uVar24 = (ulong)(uVar5 - 0xf) + lVar31;
                *(char *)plVar11 = -0x10;
                if (0xfe < (int)uVar24) {
                  if (0x1fc < (int)uVar25) {
                    uVar25 = 0x1fd;
                  }
                  uVar10 = (uVar5 - uVar25) + iVar26 + 0xef;
                  uVar24 = (ulong)uVar10 / 0xff;
                  memset(plVar29,0xff,(ulong)(uVar10 / 0xff + 1));
                  plVar29 = (long *)((long)plVar11 + uVar24 + 2);
                  uVar24 = (ulong)((uVar5 - 0x10e) + iVar26 + (int)uVar24 * -0xff);
                }
                *(char *)plVar29 = (char)uVar24;
                plVar19 = (long *)((long)plVar29 + 1);
              }
              plVar29 = (long *)(uVar36 + (long)plVar19);
              plVar27 = local_c0;
              do {
                *plVar19 = *plVar27;
                plVar19 = plVar19 + 1;
                plVar27 = plVar27 + 1;
              } while (plVar19 < plVar29);
            }
            iVar26 = 1;
            piVar14 = piVar21;
            plVar19 = plVar15;
            if (pcVar16 <= pcVar23) {
              while( true ) {
                *(short *)plVar29 = (short)plVar15 - (short)piVar21;
                plVar27 = (long *)((long)plVar29 + 2);
                uVar10 = LZ4_count((BYTE *)((long)plVar15 + 4),(BYTE *)(piVar21 + 1),pBVar22 + -5);
                pcVar16 = (char *)((long)plVar29 + (ulong)(uVar10 >> 8) + 8);
                if (pcVar16 <= pcVar23) {
                  if (uVar10 < 0xf) {
                    *(char *)plVar11 = (char)*plVar11 + (char)uVar10;
                  }
                  else {
                    *(char *)plVar11 = (char)*plVar11 + '\x0f';
                    uVar5 = uVar10 - 0xf;
                    *(undefined4 *)plVar27 = 0xffffffff;
                    if (0x3fb < uVar5) {
                      uVar25 = uVar10 - 0x40b;
                      memset((char *)((long)plVar29 + 6),0xff,(ulong)((uVar25 / 0x3fc) * 4 + 4));
                      uVar5 = uVar25 % 0x3fc;
                      plVar27 = (long *)((long)plVar29 + (ulong)((uVar25 / 0x3fc) * 4) + 6);
                    }
                    pcVar28 = (char *)((long)plVar27 + (ulong)uVar5 / 0xff);
                    plVar27 = (long *)(pcVar28 + 1);
                    *pcVar28 = (char)(uVar5 / 0xff) + (char)uVar5;
                  }
                }
                iVar26 = 1;
                plVar15 = (long *)((long)plVar15 + (ulong)(uVar10 + 4));
                piVar14 = piVar21;
                plVar29 = plVar27;
                plVar19 = plVar15;
                if (pcVar23 < pcVar16) goto LAB_001099f9;
                local_c0 = plVar15;
                if (pBVar22 + -0xc < plVar15) {
                  iVar26 = 4;
                  goto LAB_001099f9;
                }
                *(int *)((long)LZ4_stream +
                        ((ulong)(*(long *)((long)plVar15 + -2) * -0x30e4432345000000) >> 0x34) * 4)
                     = ((int)plVar15 + -2) - iVar6;
                uVar24 = (ulong)(*plVar15 * -0x30e4432345000000) >> 0x34;
                uVar36 = (ulong)*(uint *)((long)LZ4_stream + uVar24 * 4);
                piVar21 = (int *)(lVar12 + uVar36);
                *(int *)((long)LZ4_stream + uVar24 * 4) = (int)plVar15 - iVar6;
                if (((piVar21 < piVar17) || ((long *)(uVar36 + lVar12 + 0xffff) < plVar15)) ||
                   (*piVar21 != (int)*plVar15)) break;
                plVar29 = (long *)((long)plVar27 + 1);
                *(char *)plVar27 = '\0';
                plVar11 = plVar27;
              }
              uVar18 = (ulong)(*(long *)((long)plVar15 + 1) * -0x30e4432345000000) >> 0x34;
              iVar26 = 0;
              piVar14 = piVar21;
              plVar19 = (long *)((long)plVar15 + 1);
            }
          }
LAB_001099f9:
          plVar11 = plVar29;
        } while (iVar26 == 0);
        if (iVar26 - 3U < 2) goto LAB_00109a19;
        goto LAB_00109acb;
      }
LAB_00109a19:
      iVar34 = 0;
      uVar18 = (long)pBVar22 - (long)local_c0;
      pcVar23 = (char *)((long)plVar29 + (uVar18 + 0xf0) / 0xff + (uVar18 - (long)dest) + 1);
      if (pcVar23 <= (char *)(ulong)(uint)maxOutputSize) {
        if (uVar18 < 0xf) {
          *(char *)plVar29 = (char)uVar18 << 4;
        }
        else {
          uVar36 = uVar18 - 0xf;
          *(char *)plVar29 = -0x10;
          plVar19 = (long *)((long)plVar29 + 1);
          if (0xfe < uVar36) {
            uVar36 = (uVar18 - 0x10e) / 0xff;
            memset(plVar19,0xff,uVar36 + 1);
            plVar19 = (long *)((long)plVar29 + uVar36 + 2);
            uVar36 = (uVar18 + uVar36 * -0xff) - 0x10e;
          }
          *(char *)plVar19 = (char)uVar36;
          plVar29 = plVar19;
        }
        memcpy((char *)((long)plVar29 + 1),local_c0,uVar18);
        plVar29 = (long *)((long)plVar29 + uVar18 + 1);
      }
      iVar4 = (int)plVar29;
      if ((char *)(ulong)(uint)maxOutputSize < pcVar23) goto LAB_00109b18;
LAB_00109b12:
      iVar34 = iVar4 - iVar32;
    }
    else {
LAB_0010902d:
      iVar34 = 0;
      if ((uint)inputSize < 0x7e000001) {
        plVar29 = (long *)dest;
        if (0xc < inputSize) {
          piVar14 = (int *)(source + -uVar18);
          pcVar23 = dest + maxOutputSize;
          lVar12 = (long)source - (ulong)(LZ4_stream->internal_donotuse).currentOffset;
          *(uint32_t *)
           ((long)LZ4_stream + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4) =
               (LZ4_stream->internal_donotuse).currentOffset;
          plVar19 = (long *)(source + 1);
          uVar18 = (ulong)(*(long *)(source + 1) * -0x30e4432345000000) >> 0x34;
          plVar11 = (long *)dest;
          do {
            uVar24 = 1;
            uVar36 = uVar18;
            uVar10 = iVar4 << 6;
            while( true ) {
              plVar29 = (long *)(uVar24 + (long)plVar19);
              iVar34 = (int)plVar19;
              iVar6 = (int)lVar12;
              if (pBVar22 + -0xc < plVar29) break;
              source = (char *)((ulong)*(uint *)((long)LZ4_stream + uVar36 * 4) + lVar12);
              uVar18 = (ulong)(*plVar29 * -0x30e4432345000000) >> 0x34;
              *(int *)((long)LZ4_stream + uVar36 * 4) = iVar34 - iVar6;
              if ((plVar19 <= (long *)((long)source + 0xffffU)) && (*(int *)source == (int)*plVar19)
                 ) {
                iVar26 = 0;
                goto LAB_0010912c;
              }
              uVar24 = (ulong)(uVar10 >> 6);
              uVar10 = uVar10 + 1;
              plVar19 = plVar29;
              uVar36 = uVar18;
            }
            iVar26 = 3;
            uVar18 = uVar36;
LAB_0010912c:
            plVar29 = plVar11;
            if (iVar26 == 0) {
              uVar5 = iVar34 - (int)local_c0;
              lVar2 = 0;
              uVar10 = uVar5 - 0xf;
              cVar3 = (char)plVar19 * '\x10' + (char)local_c0 * -0x10;
              do {
                cVar30 = cVar3;
                uVar25 = uVar10;
                lVar31 = lVar2;
                piVar17 = (int *)((long)source + lVar31);
                plVar15 = (long *)((long)plVar19 + lVar31);
                if ((piVar17 <= piVar14) || (plVar15 <= local_c0)) break;
                lVar2 = lVar31 + -1;
                uVar10 = uVar25 - 1;
                cVar3 = cVar30 + -0x10;
              } while (*(char *)((long)plVar19 + lVar31 + -1) ==
                       *(char *)((long)source + lVar31 + -1));
              iVar26 = (int)lVar31;
              uVar36 = (ulong)(uint)((iVar34 - (int)local_c0) + iVar26);
              plVar29 = (long *)((long)plVar11 + 1);
              pcVar16 = (char *)((long)plVar11 +
                                ((ulong)uVar5 + lVar31 & 0xffffffff) / 0xff + uVar36 + 9);
              if (pcVar16 <= pcVar23) {
                if ((uint)((ulong)uVar5 + lVar31) < 0xf) {
                  *(char *)plVar11 = cVar30;
                  plVar19 = plVar29;
                }
                else {
                  uVar24 = (ulong)(uVar5 - 0xf) + lVar31;
                  *(char *)plVar11 = -0x10;
                  if (0xfe < (int)uVar24) {
                    if (0x1fc < (int)uVar25) {
                      uVar25 = 0x1fd;
                    }
                    uVar10 = (uVar5 - uVar25) + iVar26 + 0xef;
                    uVar24 = (ulong)uVar10 / 0xff;
                    memset(plVar29,0xff,(ulong)(uVar10 / 0xff + 1));
                    plVar29 = (long *)((long)plVar11 + uVar24 + 2);
                    uVar24 = (ulong)((uVar5 - 0x10e) + iVar26 + (int)uVar24 * -0xff);
                  }
                  *(char *)plVar29 = (char)uVar24;
                  plVar19 = (long *)((long)plVar29 + 1);
                }
                plVar29 = (long *)(uVar36 + (long)plVar19);
                plVar27 = local_c0;
                do {
                  *plVar19 = *plVar27;
                  plVar19 = plVar19 + 1;
                  plVar27 = plVar27 + 1;
                } while (plVar19 < plVar29);
              }
              iVar26 = 1;
              source = (char *)piVar17;
              plVar19 = plVar15;
              if (pcVar16 <= pcVar23) {
                while( true ) {
                  *(short *)plVar29 = (short)plVar15 - (short)piVar17;
                  plVar27 = (long *)((long)plVar29 + 2);
                  uVar10 = LZ4_count((BYTE *)((long)plVar15 + 4),(BYTE *)(piVar17 + 1),pBVar22 + -5)
                  ;
                  pcVar16 = (char *)((long)plVar29 + (ulong)(uVar10 >> 8) + 8);
                  if (pcVar16 <= pcVar23) {
                    if (uVar10 < 0xf) {
                      *(char *)plVar11 = (char)*plVar11 + (char)uVar10;
                    }
                    else {
                      *(char *)plVar11 = (char)*plVar11 + '\x0f';
                      uVar5 = uVar10 - 0xf;
                      *(undefined4 *)plVar27 = 0xffffffff;
                      if (0x3fb < uVar5) {
                        uVar25 = uVar10 - 0x40b;
                        memset((char *)((long)plVar29 + 6),0xff,(ulong)((uVar25 / 0x3fc) * 4 + 4));
                        uVar5 = uVar25 % 0x3fc;
                        plVar27 = (long *)((long)plVar29 + (ulong)((uVar25 / 0x3fc) * 4) + 6);
                      }
                      pcVar28 = (char *)((long)plVar27 + (ulong)uVar5 / 0xff);
                      plVar27 = (long *)(pcVar28 + 1);
                      *pcVar28 = (char)(uVar5 / 0xff) + (char)uVar5;
                    }
                  }
                  iVar26 = 1;
                  plVar15 = (long *)((long)plVar15 + (ulong)(uVar10 + 4));
                  source = (char *)piVar17;
                  plVar29 = plVar27;
                  plVar19 = plVar15;
                  if (pcVar23 < pcVar16) goto LAB_00109480;
                  local_c0 = plVar15;
                  if (pBVar22 + -0xc < plVar15) {
                    iVar26 = 4;
                    goto LAB_00109480;
                  }
                  *(int *)((long)LZ4_stream +
                          ((ulong)(*(long *)((long)plVar15 + -2) * -0x30e4432345000000) >> 0x34) * 4
                          ) = ((int)plVar15 + -2) - iVar6;
                  uVar36 = (ulong)(*plVar15 * -0x30e4432345000000) >> 0x34;
                  uVar24 = (ulong)*(uint *)((long)LZ4_stream + uVar36 * 4);
                  piVar17 = (int *)(lVar12 + uVar24);
                  *(int *)((long)LZ4_stream + uVar36 * 4) = (int)plVar15 - iVar6;
                  if (((long *)(lVar12 + uVar24 + 0xffff) < plVar15) || (*piVar17 != (int)*plVar15))
                  break;
                  plVar29 = (long *)((long)plVar27 + 1);
                  *(char *)plVar27 = '\0';
                  plVar11 = plVar27;
                }
                uVar18 = (ulong)(*(long *)((long)plVar15 + 1) * -0x30e4432345000000) >> 0x34;
                iVar26 = 0;
                source = (char *)piVar17;
                plVar19 = (long *)((long)plVar15 + 1);
              }
            }
LAB_00109480:
            plVar11 = plVar29;
          } while (iVar26 == 0);
          if (1 < iVar26 - 3U) {
LAB_00109acb:
            iVar34 = 0;
            goto LAB_00109b18;
          }
        }
        iVar34 = 0;
        uVar18 = (long)pBVar22 - (long)local_c0;
        pcVar23 = (char *)((long)plVar29 + (uVar18 + 0xf0) / 0xff + (uVar18 - (long)dest) + 1);
        if (pcVar23 <= (char *)(ulong)(uint)maxOutputSize) {
          if (uVar18 < 0xf) {
            *(char *)plVar29 = (char)uVar18 << 4;
          }
          else {
            uVar36 = uVar18 - 0xf;
            *(char *)plVar29 = -0x10;
            plVar19 = (long *)((long)plVar29 + 1);
            if (0xfe < uVar36) {
              uVar36 = (uVar18 - 0x10e) / 0xff;
              memset(plVar19,0xff,uVar36 + 1);
              plVar19 = (long *)((long)plVar29 + uVar36 + 2);
              uVar36 = (uVar18 + uVar36 * -0xff) - 0x10e;
            }
            *(char *)plVar19 = (char)uVar36;
            plVar29 = plVar19;
          }
          memcpy((char *)((long)plVar29 + 1),local_c0,uVar18);
          plVar29 = (long *)((long)plVar29 + uVar18 + 1);
        }
        iVar4 = (int)plVar29;
        if (pcVar23 <= (char *)(ulong)(uint)maxOutputSize) goto LAB_00109b12;
      }
    }
LAB_00109b18:
    uVar7 = (LZ4_stream->internal_donotuse).dictSize + inputSize;
    goto LAB_00109b70;
  }
  if (uVar10 < 0x10000) {
    uVar5 = (LZ4_stream->internal_donotuse).currentOffset;
    if (uVar5 <= uVar10) goto LAB_001089c8;
    iVar34 = 0;
    if ((uint)inputSize < 0x7e000001) {
      local_b0 = (long *)dest;
      local_90 = (long *)source;
      if (inputSize < 0xd) {
LAB_00108910:
        iVar34 = 0;
        uVar18 = (long)pBVar22 - (long)local_90;
        pcVar23 = (char *)((long)local_b0 + (uVar18 + 0xf0) / 0xff + (uVar18 - (long)dest) + 1);
        if (pcVar23 <= (char *)(ulong)(uint)maxOutputSize) {
          if (uVar18 < 0xf) {
            *(char *)local_b0 = (char)uVar18 << 4;
          }
          else {
            uVar36 = uVar18 - 0xf;
            *(char *)local_b0 = -0x10;
            plVar29 = (long *)((long)local_b0 + 1);
            if (0xfe < uVar36) {
              uVar36 = (uVar18 - 0x10e) / 0xff;
              memset(plVar29,0xff,uVar36 + 1);
              plVar29 = (long *)((long)local_b0 + uVar36 + 2);
              uVar36 = (uVar18 + uVar36 * -0xff) - 0x10e;
            }
            *(char *)plVar29 = (char)uVar36;
            local_b0 = plVar29;
          }
          memcpy((char *)((long)local_b0 + 1),local_90,uVar18);
          local_b0 = (long *)((long)local_b0 + uVar18 + 1);
        }
        if (pcVar23 <= (char *)(ulong)(uint)maxOutputSize) {
          iVar34 = (int)local_b0 - iVar32;
        }
        goto LAB_00109b62;
      }
      puVar1 = (LZ4_stream->internal_donotuse).dictionary;
      plVar29 = (long *)(pBVar22 + -0xc);
      plVar11 = (long *)(pBVar22 + -5);
      pcVar23 = dest + maxOutputSize;
      lVar12 = (long)source - (ulong)uVar5;
      *(uint *)((long)LZ4_stream + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4) =
           uVar5;
      plVar19 = (long *)(source + 1);
      uVar36 = (ulong)(*(long *)(source + 1) * -0x30e4432345000000) >> 0x34;
      local_40 = in_R10;
      puVar33 = (uint8_t *)source;
      do {
        uVar24 = 1;
        puVar20 = (uint8_t *)0x0;
        uVar10 = iVar4 << 6;
        while( true ) {
          plVar15 = (long *)(uVar24 + (long)plVar19);
          iVar34 = (int)lVar12;
          if (plVar29 < plVar15) {
            iVar6 = 3;
          }
          else {
            local_40 = (char *)((ulong)*(uint *)((long)LZ4_stream + uVar36 * 4) + lVar12);
            iVar6 = 0;
            puVar33 = (uint8_t *)source;
            puVar20 = (uint8_t *)0x0;
            if (local_40 < source) {
              puVar33 = puVar1;
              puVar20 = puVar1 + (uVar18 - (long)source);
            }
            lVar2 = *plVar15;
            *(int *)((long)LZ4_stream + uVar36 * 4) = (int)plVar19 - iVar34;
            uVar36 = (ulong)(lVar2 * -0x30e4432345000000) >> 0x34;
          }
          if (plVar29 < plVar15) goto LAB_001084c6;
          if (((source + -uVar18 <= local_40) && (plVar19 <= local_40 + 0xffff)) &&
             (*(int *)(local_40 + (long)puVar20) == (int)*plVar19)) break;
          uVar24 = (ulong)(uVar10 >> 6);
          uVar10 = uVar10 + 1;
          plVar19 = plVar15;
        }
        iVar6 = 0;
LAB_001084c6:
        plVar15 = local_b0;
        if (iVar6 == 0) {
          if ((local_90 < plVar19) && (puVar33 < local_40 + (long)puVar20)) {
            pcVar16 = local_40;
            do {
              plVar15 = (long *)((long)plVar19 + -1);
              local_40 = pcVar16;
              if ((*(char *)plVar15 != pcVar16[(long)(puVar20 + -1)]) ||
                 (local_40 = pcVar16 + -1, plVar19 = plVar15, plVar15 <= local_90)) break;
              puVar8 = (uint8_t *)(pcVar16 + (long)(puVar20 + -1));
              pcVar16 = local_40;
            } while (puVar33 < puVar8);
          }
          uVar24 = (long)plVar19 - (long)local_90;
          plVar15 = (long *)((long)local_b0 + 1);
          uVar13 = uVar24 & 0xffffffff;
          pcVar16 = (char *)((long)local_b0 + uVar13 / 0xff + uVar13 + 9);
          if (pcVar16 <= pcVar23) {
            if ((uint)uVar24 < 0xf) {
              *(char *)local_b0 = (char)uVar24 << 4;
              plVar27 = plVar15;
            }
            else {
              iVar6 = (uint)uVar24 - 0xf;
              *(char *)local_b0 = -0x10;
              if (0xfe < iVar6) {
                if (0x1fc < iVar6) {
                  iVar6 = 0x1fd;
                }
                uVar10 = ((int)plVar19 - (iVar6 + (int)local_90)) + 0xef;
                uVar24 = (ulong)uVar10 / 0xff;
                memset(plVar15,0xff,(ulong)(uVar10 / 0xff + 1));
                plVar15 = (long *)((long)local_b0 + uVar24 + 2);
                iVar6 = ((int)plVar19 - (int)local_90) + (int)uVar24 * -0xff + -0x10e;
              }
              *(char *)plVar15 = (char)iVar6;
              plVar27 = (long *)((long)plVar15 + 1);
            }
            plVar15 = (long *)(uVar13 + (long)plVar27);
            plVar9 = local_90;
            do {
              *plVar27 = *plVar9;
              plVar27 = plVar27 + 1;
              plVar9 = plVar9 + 1;
            } while (plVar27 < plVar15);
          }
          iVar6 = 1;
          if (pcVar16 <= pcVar23) {
            while( true ) {
              *(short *)plVar15 = (short)plVar19 - (short)local_40;
              if (puVar33 == puVar1) {
                pcVar16 = local_40 + (long)puVar20;
                plVar27 = (long *)(puVar1 + (uVar18 - (long)pcVar16) + (long)plVar19);
                if (plVar11 < puVar1 + (uVar18 - (long)pcVar16) + (long)plVar19) {
                  plVar27 = plVar11;
                }
                uVar10 = LZ4_count((BYTE *)((long)plVar19 + 4),
                                   (BYTE *)(local_40 + (long)(puVar20 + 4)),(BYTE *)plVar27);
                uVar24 = (ulong)uVar10;
                plVar19 = (long *)((long)plVar19 + (ulong)(uVar10 + 4));
                local_40 = pcVar16;
                if (plVar19 == plVar27) {
                  uVar5 = LZ4_count((BYTE *)plVar19,(BYTE *)source,(BYTE *)plVar11);
                  uVar24 = (ulong)(uVar10 + uVar5);
                  plVar19 = (long *)((long)plVar19 + (ulong)uVar5);
                }
              }
              else {
                uVar10 = LZ4_count((BYTE *)((long)plVar19 + 4),(BYTE *)(local_40 + 4),
                                   (BYTE *)plVar11);
                uVar24 = (ulong)uVar10;
                plVar19 = (long *)((long)plVar19 + (ulong)(uVar10 + 4));
              }
              plVar27 = (long *)((long)plVar15 + 2);
              uVar10 = (uint)uVar24;
              pcVar16 = (char *)((long)plVar15 + (uVar24 >> 8) + 8);
              if (pcVar16 <= pcVar23) {
                if (uVar10 < 0xf) {
                  *(char *)local_b0 = (char)*local_b0 + (char)uVar24;
                }
                else {
                  *(char *)local_b0 = (char)*local_b0 + '\x0f';
                  uVar5 = uVar10 - 0xf;
                  *(undefined4 *)plVar27 = 0xffffffff;
                  if (0x3fb < uVar5) {
                    uVar10 = uVar10 - 0x40b;
                    memset((char *)((long)plVar15 + 6),0xff,(ulong)((uVar10 / 0x3fc) * 4 + 4));
                    uVar5 = uVar10 % 0x3fc;
                    plVar27 = (long *)((long)plVar15 + (ulong)((uVar10 / 0x3fc) * 4) + 6);
                  }
                  pcVar28 = (char *)((long)plVar27 + (ulong)uVar5 / 0xff);
                  *pcVar28 = (char)((ulong)uVar5 * 0x8080808081 >> 0x27);
                  plVar27 = (long *)(pcVar28 + 1);
                }
              }
              local_b0 = plVar27;
              plVar15 = local_b0;
              if (pcVar23 < pcVar16) {
                iVar6 = 1;
                goto LAB_001088e6;
              }
              local_90 = plVar19;
              if (plVar29 < plVar19) {
                iVar6 = 4;
                goto LAB_001088e6;
              }
              *(int *)((long)LZ4_stream +
                      ((ulong)(*(long *)((long)plVar19 + -2) * -0x30e4432345000000) >> 0x34) * 4) =
                   ((int)plVar19 + -2) - iVar34;
              uVar13 = (ulong)(*plVar19 * -0x30e4432345000000) >> 0x34;
              uVar24 = (ulong)*(uint *)((long)LZ4_stream + uVar13 * 4);
              local_40 = (char *)(lVar12 + uVar24);
              puVar33 = (uint8_t *)source;
              puVar20 = (uint8_t *)0x0;
              if (local_40 < source) {
                puVar33 = puVar1;
                puVar20 = puVar1 + (uVar18 - (long)source);
              }
              *(int *)((long)LZ4_stream + uVar13 * 4) = (int)plVar19 - iVar34;
              if (((local_40 < source + -uVar18) || ((long *)(uVar24 + lVar12 + 0xffff) < plVar19))
                 || (*(int *)(local_40 + (long)puVar20) != (int)*plVar19)) break;
              plVar15 = (long *)((long)local_b0 + 1);
              *(char *)local_b0 = '\0';
            }
            uVar36 = (ulong)(*(long *)((long)plVar19 + 1) * -0x30e4432345000000) >> 0x34;
            iVar6 = 0;
            plVar19 = (long *)((long)plVar19 + 1);
          }
        }
LAB_001088e6:
        local_b0 = plVar15;
      } while (iVar6 == 0);
      if (iVar6 - 3U < 2) goto LAB_00108910;
LAB_00109564:
      iVar34 = 0;
    }
  }
  else {
LAB_001089c8:
    iVar34 = 0;
    if ((uint)inputSize < 0x7e000001) {
      local_c8 = (long *)dest;
      local_b0 = (long *)source;
      if (0xc < inputSize) {
        puVar1 = (LZ4_stream->internal_donotuse).dictionary;
        plVar29 = (long *)(pBVar22 + -0xc);
        plVar11 = (long *)(pBVar22 + -5);
        pcVar23 = dest + maxOutputSize;
        lVar12 = (long)source - (ulong)(LZ4_stream->internal_donotuse).currentOffset;
        *(uint32_t *)
         ((long)LZ4_stream + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4) =
             (LZ4_stream->internal_donotuse).currentOffset;
        plVar19 = (long *)(source + 1);
        uVar36 = (ulong)(*(long *)(source + 1) * -0x30e4432345000000) >> 0x34;
        local_78 = in_R10;
        puVar33 = (uint8_t *)source;
        do {
          uVar24 = 1;
          puVar20 = (uint8_t *)0x0;
          uVar10 = iVar4 << 6;
          while( true ) {
            plVar15 = (long *)(uVar24 + (long)plVar19);
            iVar34 = (int)lVar12;
            if (plVar29 < plVar15) {
              iVar6 = 3;
            }
            else {
              local_78 = (char *)((ulong)*(uint *)((long)LZ4_stream + uVar36 * 4) + lVar12);
              iVar6 = 0;
              puVar33 = (uint8_t *)source;
              puVar20 = (uint8_t *)0x0;
              if (local_78 < source) {
                puVar33 = puVar1;
                puVar20 = puVar1 + (uVar18 - (long)source);
              }
              lVar2 = *plVar15;
              *(int *)((long)LZ4_stream + uVar36 * 4) = (int)plVar19 - iVar34;
              uVar36 = (ulong)(lVar2 * -0x30e4432345000000) >> 0x34;
            }
            if (plVar29 < plVar15) goto LAB_00108b14;
            if ((plVar19 <= local_78 + 0xffff) &&
               (*(int *)(local_78 + (long)puVar20) == (int)*plVar19)) break;
            uVar24 = (ulong)(uVar10 >> 6);
            uVar10 = uVar10 + 1;
            plVar19 = plVar15;
          }
          iVar6 = 0;
LAB_00108b14:
          plVar15 = local_c8;
          if (iVar6 == 0) {
            if ((local_b0 < plVar19) && (puVar33 < local_78 + (long)puVar20)) {
              pcVar16 = local_78;
              do {
                plVar15 = (long *)((long)plVar19 + -1);
                local_78 = pcVar16;
                if ((*(char *)plVar15 != pcVar16[(long)(puVar20 + -1)]) ||
                   (local_78 = pcVar16 + -1, plVar19 = plVar15, plVar15 <= local_b0)) break;
                puVar8 = (uint8_t *)(pcVar16 + (long)(puVar20 + -1));
                pcVar16 = local_78;
              } while (puVar33 < puVar8);
            }
            uVar24 = (long)plVar19 - (long)local_b0;
            plVar15 = (long *)((long)local_c8 + 1);
            uVar13 = uVar24 & 0xffffffff;
            pcVar16 = (char *)((long)local_c8 + uVar13 / 0xff + uVar13 + 9);
            if (pcVar16 <= pcVar23) {
              if ((uint)uVar24 < 0xf) {
                *(char *)local_c8 = (char)uVar24 << 4;
                plVar27 = plVar15;
              }
              else {
                iVar6 = (uint)uVar24 - 0xf;
                *(char *)local_c8 = -0x10;
                if (0xfe < iVar6) {
                  if (0x1fc < iVar6) {
                    iVar6 = 0x1fd;
                  }
                  uVar10 = ((int)plVar19 - (iVar6 + (int)local_b0)) + 0xef;
                  uVar24 = (ulong)uVar10 / 0xff;
                  memset(plVar15,0xff,(ulong)(uVar10 / 0xff + 1));
                  plVar15 = (long *)((long)local_c8 + uVar24 + 2);
                  iVar6 = ((int)plVar19 - (int)local_b0) + (int)uVar24 * -0xff + -0x10e;
                }
                *(char *)plVar15 = (char)iVar6;
                plVar27 = (long *)((long)plVar15 + 1);
              }
              plVar15 = (long *)(uVar13 + (long)plVar27);
              plVar9 = local_b0;
              do {
                *plVar27 = *plVar9;
                plVar27 = plVar27 + 1;
                plVar9 = plVar9 + 1;
              } while (plVar27 < plVar15);
            }
            iVar6 = 1;
            if (pcVar16 <= pcVar23) {
              while( true ) {
                *(short *)plVar15 = (short)plVar19 - (short)local_78;
                if (puVar33 == puVar1) {
                  pcVar16 = local_78 + (long)puVar20;
                  plVar27 = (long *)(puVar1 + (uVar18 - (long)pcVar16) + (long)plVar19);
                  if (plVar11 < puVar1 + (uVar18 - (long)pcVar16) + (long)plVar19) {
                    plVar27 = plVar11;
                  }
                  uVar10 = LZ4_count((BYTE *)((long)plVar19 + 4),
                                     (BYTE *)(local_78 + (long)(puVar20 + 4)),(BYTE *)plVar27);
                  plVar19 = (long *)((long)plVar19 + (ulong)(uVar10 + 4));
                  local_78 = pcVar16;
                  if (plVar19 == plVar27) {
                    uVar5 = LZ4_count((BYTE *)plVar19,(BYTE *)source,(BYTE *)plVar11);
                    uVar10 = uVar10 + uVar5;
                    plVar19 = (long *)((long)plVar19 + (ulong)uVar5);
                  }
                }
                else {
                  uVar10 = LZ4_count((BYTE *)((long)plVar19 + 4),(BYTE *)(local_78 + 4),
                                     (BYTE *)plVar11);
                  plVar19 = (long *)((long)plVar19 + (ulong)(uVar10 + 4));
                }
                plVar27 = (long *)((long)plVar15 + 2);
                pcVar16 = (char *)((long)plVar15 + (ulong)(uVar10 >> 8) + 8);
                if (pcVar16 <= pcVar23) {
                  if (uVar10 < 0xf) {
                    *(char *)local_c8 = (char)*local_c8 + (char)uVar10;
                  }
                  else {
                    *(char *)local_c8 = (char)*local_c8 + '\x0f';
                    uVar5 = uVar10 - 0xf;
                    *(undefined4 *)plVar27 = 0xffffffff;
                    if (0x3fb < uVar5) {
                      uVar10 = uVar10 - 0x40b;
                      memset((char *)((long)plVar15 + 6),0xff,(ulong)((uVar10 / 0x3fc) * 4 + 4));
                      uVar5 = uVar10 % 0x3fc;
                      plVar27 = (long *)((long)plVar15 + (ulong)((uVar10 / 0x3fc) * 4) + 6);
                    }
                    pcVar28 = (char *)((long)plVar27 + (ulong)uVar5 / 0xff);
                    *pcVar28 = (char)((ulong)uVar5 * 0x8080808081 >> 0x27);
                    plVar27 = (long *)(pcVar28 + 1);
                  }
                }
                local_c8 = plVar27;
                plVar15 = local_c8;
                if (pcVar23 < pcVar16) {
                  iVar6 = 1;
                  goto LAB_00108f16;
                }
                local_b0 = plVar19;
                if (plVar29 < plVar19) {
                  iVar6 = 4;
                  goto LAB_00108f16;
                }
                *(int *)((long)LZ4_stream +
                        ((ulong)(*(long *)((long)plVar19 + -2) * -0x30e4432345000000) >> 0x34) * 4)
                     = ((int)plVar19 + -2) - iVar34;
                uVar24 = (ulong)(*plVar19 * -0x30e4432345000000) >> 0x34;
                uVar13 = (ulong)*(uint *)((long)LZ4_stream + uVar24 * 4);
                local_78 = (char *)(lVar12 + uVar13);
                puVar33 = (uint8_t *)source;
                puVar20 = (uint8_t *)0x0;
                if (local_78 < source) {
                  puVar33 = puVar1;
                  puVar20 = puVar1 + (uVar18 - (long)source);
                }
                *(int *)((long)LZ4_stream + uVar24 * 4) = (int)plVar19 - iVar34;
                if (((long *)(lVar12 + uVar13 + 0xffff) < plVar19) ||
                   (*(int *)(local_78 + (long)puVar20) != (int)*plVar19)) break;
                plVar15 = (long *)((long)local_c8 + 1);
                *(char *)local_c8 = '\0';
              }
              uVar36 = (ulong)(*(long *)((long)plVar19 + 1) * -0x30e4432345000000) >> 0x34;
              iVar6 = 0;
              plVar19 = (long *)((long)plVar19 + 1);
            }
          }
LAB_00108f16:
          local_c8 = plVar15;
        } while (iVar6 == 0);
        if (1 < iVar6 - 3U) goto LAB_00109564;
      }
      iVar34 = 0;
      uVar18 = (long)pBVar22 - (long)local_b0;
      pcVar23 = (char *)((long)local_c8 + (uVar18 + 0xf0) / 0xff + (uVar18 - (long)dest) + 1);
      if (pcVar23 <= (char *)(ulong)(uint)maxOutputSize) {
        if (uVar18 < 0xf) {
          *(char *)local_c8 = (char)uVar18 << 4;
        }
        else {
          uVar36 = uVar18 - 0xf;
          *(char *)local_c8 = -0x10;
          plVar29 = (long *)((long)local_c8 + 1);
          if (0xfe < uVar36) {
            uVar24 = (uVar18 - 0x10e) / 0xff;
            memset((long *)((long)local_c8 + 1),0xff,uVar24 + 1);
            uVar36 = (uVar18 + uVar24 * -0xff) - 0x10e;
            plVar29 = (long *)((long)local_c8 + uVar24 + 2);
          }
          local_c8 = plVar29;
          *(char *)local_c8 = (char)uVar36;
        }
        memcpy((char *)((long)local_c8 + 1),local_b0,uVar18);
        local_c8 = (long *)((long)local_c8 + uVar18 + 1);
      }
      if (pcVar23 <= (char *)(ulong)(uint)maxOutputSize) {
        iVar34 = (int)local_c8 - iVar32;
      }
    }
  }
LAB_00109b62:
  (LZ4_stream->internal_donotuse).dictionary = (uint8_t *)source;
  uVar7 = inputSize;
LAB_00109b70:
  (LZ4_stream->internal_donotuse).dictSize = uVar7;
  (LZ4_stream->internal_donotuse).currentOffset =
       (LZ4_stream->internal_donotuse).currentOffset + inputSize;
  return iVar34;
}

Assistant:

int LZ4_compress_fast_continue (LZ4_stream_t* LZ4_stream, const char* source, char* dest, int inputSize, int maxOutputSize, int acceleration)
{
    LZ4_stream_t_internal* streamPtr = &LZ4_stream->internal_donotuse;
    const BYTE* const dictEnd = streamPtr->dictionary + streamPtr->dictSize;

    const BYTE* smallest = (const BYTE*) source;
    if (streamPtr->initCheck) return 0;   /* Uninitialized structure detected */
    if ((streamPtr->dictSize>0) && (smallest>dictEnd)) smallest = dictEnd;
    LZ4_renormDictT(streamPtr, smallest);
    if (acceleration < 1) acceleration = ACCELERATION_DEFAULT;

    /* Check overlapping input/dictionary space */
    {   const BYTE* sourceEnd = (const BYTE*) source + inputSize;
        if ((sourceEnd > streamPtr->dictionary) && (sourceEnd < dictEnd)) {
            streamPtr->dictSize = (U32)(dictEnd - sourceEnd);
            if (streamPtr->dictSize > 64 KB) streamPtr->dictSize = 64 KB;
            if (streamPtr->dictSize < 4) streamPtr->dictSize = 0;
            streamPtr->dictionary = dictEnd - streamPtr->dictSize;
        }
    }

    /* prefix mode : source data follows dictionary */
    if (dictEnd == (const BYTE*)source) {
        int result;
        if ((streamPtr->dictSize < 64 KB) && (streamPtr->dictSize < streamPtr->currentOffset))
            result = LZ4_compress_generic(streamPtr, source, dest, inputSize, maxOutputSize, limitedOutput, byU32, withPrefix64k, dictSmall, acceleration);
        else
            result = LZ4_compress_generic(streamPtr, source, dest, inputSize, maxOutputSize, limitedOutput, byU32, withPrefix64k, noDictIssue, acceleration);
        streamPtr->dictSize += (U32)inputSize;
        streamPtr->currentOffset += (U32)inputSize;
        return result;
    }

    /* external dictionary mode */
    {   int result;
        if ((streamPtr->dictSize < 64 KB) && (streamPtr->dictSize < streamPtr->currentOffset))
            result = LZ4_compress_generic(streamPtr, source, dest, inputSize, maxOutputSize, limitedOutput, byU32, usingExtDict, dictSmall, acceleration);
        else
            result = LZ4_compress_generic(streamPtr, source, dest, inputSize, maxOutputSize, limitedOutput, byU32, usingExtDict, noDictIssue, acceleration);
        streamPtr->dictionary = (const BYTE*)source;
        streamPtr->dictSize = (U32)inputSize;
        streamPtr->currentOffset += (U32)inputSize;
        return result;
    }
}